

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::IteratorSymbol::IteratorSymbol
          (IteratorSymbol *this,string_view name,SourceLocation loc,Type *arrayType,Type *indexType)

{
  bitmask<slang::ast::VariableFlags> *pbVar1;
  
  TempVarSymbol::TempVarSymbol(&this->super_TempVarSymbol,Iterator,name,loc,Automatic);
  this->arrayType = arrayType;
  (this->indexMethodName)._M_len = 0;
  (this->indexMethodName)._M_str = (char *)0x0;
  pbVar1 = &(this->super_TempVarSymbol).super_VariableSymbol.flags;
  *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 1;
  (this->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.declaredType.type = indexType;
  return;
}

Assistant:

IteratorSymbol::IteratorSymbol(std::string_view name, SourceLocation loc, const Type& arrayType,
                               const Type& indexType) :
    TempVarSymbol(SymbolKind::Iterator, name, loc, VariableLifetime::Automatic),
    arrayType(arrayType) {

    flags |= VariableFlags::Const;
    setType(indexType);
}